

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O0

void wait_for_entropy(void)

{
  int *piVar1;
  unsigned_long uVar2;
  unsigned_long getauxval_ret;
  char *current_process;
  ssize_t getrandom_ret;
  uint8_t dummy;
  int fd;
  
  getrandom_ret._4_4_ = urandom_fd;
  if ((urandom_fd == -3) && (getrandom_ready == 0)) {
    current_process = (char *)boringssl_getrandom((void *)((long)&getrandom_ret + 3),1,1);
    if ((current_process == (char *)0xffffffffffffffff) &&
       (piVar1 = __errno_location(), *piVar1 == 0xb)) {
      getauxval_ret = (unsigned_long)anon_var_dwarf_70b10e;
      uVar2 = getauxval(0x1f);
      if (uVar2 != 0) {
        getauxval_ret = uVar2;
      }
      fprintf(_stderr,
              "%s: getrandom indicates that the entropy pool has not been initialized. Rather than continue with poor entropy, this process will block until entropy is available.\n"
              ,getauxval_ret);
      current_process = (char *)boringssl_getrandom((void *)((long)&getrandom_ret + 3),1,0);
    }
    if (current_process != (char *)0x1) {
      perror("getrandom");
      abort();
    }
  }
  return;
}

Assistant:

static void wait_for_entropy(void) {
  int fd = urandom_fd;
  if (fd == kHaveGetrandom) {
    // |getrandom| and |getentropy| support blocking in |fill_with_entropy|
    // directly. For |getrandom|, we first probe with a non-blocking call to aid
    // debugging.
#if defined(USE_NR_getrandom)
    if (getrandom_ready) {
      // The entropy pool was already initialized in |init_once|.
      return;
    }

    uint8_t dummy;
    ssize_t getrandom_ret =
        boringssl_getrandom(&dummy, sizeof(dummy), GRND_NONBLOCK);
    if (getrandom_ret == -1 && errno == EAGAIN) {
      // Attempt to get the path of the current process to aid in debugging when
      // something blocks.
      const char *current_process = "<unknown>";
#if defined(OPENSSL_HAS_GETAUXVAL)
      const unsigned long getauxval_ret = getauxval(AT_EXECFN);
      if (getauxval_ret != 0) {
        current_process = (const char *)getauxval_ret;
      }
#endif

      fprintf(
          stderr,
          "%s: getrandom indicates that the entropy pool has not been "
          "initialized. Rather than continue with poor entropy, this process "
          "will block until entropy is available.\n",
          current_process);

      getrandom_ret =
          boringssl_getrandom(&dummy, sizeof(dummy), 0 /* no flags */);
    }

    if (getrandom_ret != 1) {
      perror("getrandom");
      abort();
    }
#endif  // USE_NR_getrandom
    return;
  }
}